

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

void predict(svm_params *params,single_learner *param_2,example *ec)

{
  svm_example *this;
  svm_example *__ptr;
  long in_RDX;
  float score;
  svm_example *sec;
  flat_example *fec;
  example *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  this = (svm_example *)
         flatten_sort_example
                   ((vw *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
  if (this != (svm_example *)0x0) {
    __ptr = calloc_or_throw<svm_example>();
    svm_example::init_svm_example
              ((svm_example *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (flat_example *)in_stack_ffffffffffffffc8);
    predict(params,(svm_example **)param_2,(float *)ec,(size_t)fec);
    *(undefined4 *)(in_RDX + 0x6850) = in_stack_ffffffffffffffd4;
    svm_example::~svm_example(this);
    free(__ptr);
  }
  return;
}

Assistant:

void predict(svm_params& params, single_learner&, example& ec)
{
  flat_example* fec = flatten_sort_example(*(params.all), &ec);
  if (fec)
  {
    svm_example* sec = &calloc_or_throw<svm_example>();
    sec->init_svm_example(fec);
    float score;
    predict(params, &sec, &score, 1);
    ec.pred.scalar = score;
    sec->~svm_example();
    free(sec);
  }
}